

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateArraySetup(ExpressionTranslateContext *ctx,ExprArraySetup *expression)

{
  TypeRef *pTVar1;
  TypeArray *pTVar2;
  TypeArray *arrayType;
  TypeRef *refType;
  ExprArraySetup *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  pTVar1 = getType<TypeRef>(expression->lhs->type);
  if (pTVar1 == (TypeRef *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0x4e3,"void TranslateArraySetup(ExpressionTranslateContext &, ExprArraySetup *)")
    ;
  }
  pTVar2 = getType<TypeArray>(pTVar1->subType);
  if (pTVar2 != (TypeArray *)0x0) {
    Print(ctx,"__nullcSetupArray((");
    Translate(ctx,expression->lhs);
    Print(ctx,")->ptr, %u, ",pTVar2->length & 0xffffffff);
    Translate(ctx,expression->initializer);
    Print(ctx,")");
    return;
  }
  __assert_fail("arrayType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                ,0x4e7,"void TranslateArraySetup(ExpressionTranslateContext &, ExprArraySetup *)");
}

Assistant:

void TranslateArraySetup(ExpressionTranslateContext &ctx, ExprArraySetup *expression)
{
	TypeRef *refType = getType<TypeRef>(expression->lhs->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	Print(ctx, "__nullcSetupArray((");
	Translate(ctx, expression->lhs);
	Print(ctx, ")->ptr, %u, ", (unsigned)arrayType->length);
	Translate(ctx, expression->initializer);
	Print(ctx, ")");
}